

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

TPZFMatrix<long_double> * __thiscall TPZMatrix<long_double>::Storage(TPZMatrix<long_double> *this)

{
  long *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  int64_t unaff_retaddr;
  longdouble *in_stack_00000008;
  int64_t in_stack_00000010;
  int64_t in_stack_00000018;
  TPZFMatrix<long_double> *in_stack_00000020;
  longdouble *elem;
  int64_t size;
  TPZFMatrix<long_double> *ref;
  
  (**(code **)(*in_RSI + 600))();
  (**(code **)(*in_RSI + 0x268))();
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return in_RDI;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}